

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O1

void WebRtcSpl_DownBy2ShortToInt(int16_t *in,int32_t len,int32_t *out,int32_t *state)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  uVar2 = len >> 1;
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      uVar4 = (int)in[uVar3 * 2] << 0xf | 0x4000;
      iVar5 = state[1];
      iVar1 = ((int)((uVar4 - iVar5) + 0x2000) >> 0xe) * 0xbea + *state;
      *state = uVar4;
      state[1] = iVar1;
      iVar1 = iVar1 - state[2];
      iVar5 = ((iVar1 >> 0xe) - (iVar1 >> 0x1f)) * 0x2498 + iVar5;
      iVar1 = iVar5 - state[3];
      iVar1 = ((iVar1 >> 0xe) - (iVar1 >> 0x1f)) * 0x3ad7 + state[2];
      state[3] = iVar1;
      state[2] = iVar5;
      out[uVar3] = iVar1 >> 1;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      uVar4 = (int)in[uVar3 * 2 + 1] << 0xf | 0x4000;
      iVar5 = state[5];
      iVar1 = ((int)((uVar4 - iVar5) + 0x2000) >> 0xe) * 0x335 + state[4];
      state[4] = uVar4;
      state[5] = iVar1;
      iVar1 = iVar1 - state[6];
      iVar5 = ((iVar1 >> 0xe) - (iVar1 >> 0x1f)) * 0x17de + iVar5;
      iVar1 = iVar5 - state[7];
      iVar1 = ((iVar1 >> 0xe) - (iVar1 >> 0x1f)) * 0x305e + state[6];
      state[7] = iVar1;
      state[6] = iVar5;
      out[uVar3] = out[uVar3] + (iVar1 >> 1);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void WebRtcSpl_DownBy2ShortToInt(const int16_t *in,
                                  int32_t len,
                                  int32_t *out,
                                  int32_t *state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    len >>= 1;

    // lower allpass filter (operates on even input samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // divide by two and store temporarily
        out[i] = (state[3] >> 1);
    }

    in++;

    // upper allpass filter (operates on odd input samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // divide by two and store temporarily
        out[i] += (state[7] >> 1);
    }

    in--;
}